

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapePoolingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  ShapeConstraint *pSVar1;
  bool bVar2;
  int iVar3;
  PoolingPaddingTypeCase PVar4;
  string *psVar5;
  mapped_type *pmVar6;
  ShapeRange *pSVar7;
  ShapeRange *pSVar8;
  uint64 uVar9;
  ValidPadding *pVVar10;
  BorderAmounts *pBVar11;
  BorderAmounts_EdgeSizes *pBVar12;
  PoolingLayerParams_ValidCompletePadding *pPVar13;
  size_t sVar14;
  size_t sVar15;
  runtime_error *this_00;
  int iVar16;
  long local_3b8;
  long local_3a8;
  ShapeRange local_328;
  ShapeRange local_308;
  ShapeRange local_2e8;
  ShapeRange local_2c8;
  ShapeRange local_2a8;
  ShapeRange local_288;
  ShapeRange local_268;
  ShapeRange local_248;
  int local_224;
  undefined1 local_220 [4];
  int addExtra;
  ShapeRange local_200;
  ShapeRange local_1e0;
  ShapeRange local_1c0;
  ShapeRange local_1a0;
  ShapeRange local_180;
  ShapeRange local_160;
  ShapeRange local_140;
  ShapeRange local_120;
  long local_100;
  size_t inputLowerBound_1;
  ShapeRange local_d8;
  ShapeRange local_b8;
  long local_98;
  size_t inputLowerBound;
  int t;
  int b;
  int r;
  int l;
  int wstride;
  int hstride;
  int Kw;
  int Kh;
  PoolingLayerParams *pool;
  ShapeRange local_48;
  mapped_type *local_28;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar5 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  outputShape = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](&this->blobShapes,psVar5);
  psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar5);
  local_28 = pmVar6;
  psVar5 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  ShapeConstraint::setName(pmVar6,psVar5);
  pmVar6 = local_28;
  pSVar7 = ShapeConstraint::sequenceRange(local_28);
  pSVar8 = ShapeConstraint::sequenceRange(outputShape);
  ShapeRange::intersect(&local_48,pSVar7,pSVar8);
  ShapeConstraint::updateSequenceRange(pmVar6,&local_48);
  pmVar6 = local_28;
  pSVar7 = ShapeConstraint::batchRange(local_28);
  pSVar8 = ShapeConstraint::batchRange(outputShape);
  ShapeRange::intersect((ShapeRange *)&pool,pSVar7,pSVar8);
  ShapeConstraint::updateBatchRange(pmVar6,(ShapeRange *)&pool);
  pmVar6 = local_28;
  pSVar7 = ShapeConstraint::channelRange(outputShape);
  ShapeConstraint::updateChannelRange(pmVar6,pSVar7);
  pSVar1 = outputShape;
  pSVar7 = ShapeConstraint::sequenceRange(local_28);
  ShapeConstraint::updateSequenceRange(pSVar1,pSVar7);
  pSVar1 = outputShape;
  pSVar7 = ShapeConstraint::batchRange(local_28);
  ShapeConstraint::updateBatchRange(pSVar1,pSVar7);
  pSVar1 = outputShape;
  pSVar7 = ShapeConstraint::channelRange(local_28);
  ShapeConstraint::updateChannelRange(pSVar1,pSVar7);
  _Kw = Specification::NeuralNetworkLayer::pooling((NeuralNetworkLayer *)inputShape);
  wstride = 3;
  hstride = 3;
  r = 1;
  l = 1;
  iVar3 = Specification::PoolingLayerParams::kernelsize_size(_Kw);
  if (iVar3 == 2) {
    uVar9 = Specification::PoolingLayerParams::kernelsize(_Kw,0);
    hstride = (int)uVar9;
    uVar9 = Specification::PoolingLayerParams::kernelsize(_Kw,1);
    wstride = (int)uVar9;
  }
  iVar3 = Specification::PoolingLayerParams::stride_size(_Kw);
  if (iVar3 == 2) {
    uVar9 = Specification::PoolingLayerParams::stride(_Kw,0);
    l = (int)uVar9;
    uVar9 = Specification::PoolingLayerParams::stride(_Kw,1);
    r = (int)uVar9;
  }
  inputLowerBound._0_4_ = 0;
  inputLowerBound._4_4_ = 0;
  t = 0;
  b = 0;
  bVar2 = Specification::PoolingLayerParams::globalpooling(_Kw);
  if (bVar2) {
    ShapeConstraint::setHeight(local_28,1);
    ShapeConstraint::setWidth(local_28,1);
  }
  else {
    PVar4 = Specification::PoolingLayerParams::PoolingPaddingType_case(_Kw);
    pmVar6 = local_28;
    switch(PVar4) {
    case POOLINGPADDINGTYPE_NOT_SET:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Pooling padding type not set");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case kValid:
      pVVar10 = Specification::PoolingLayerParams::valid(_Kw);
      pBVar11 = Specification::ValidPadding::paddingamounts(pVVar10);
      iVar3 = Specification::BorderAmounts::borderamounts_size(pBVar11);
      if (iVar3 == 2) {
        pVVar10 = Specification::PoolingLayerParams::valid(_Kw);
        pBVar11 = Specification::ValidPadding::paddingamounts(pVVar10);
        pBVar12 = Specification::BorderAmounts::borderamounts(pBVar11,0);
        uVar9 = Specification::BorderAmounts_EdgeSizes::startedgesize(pBVar12);
        inputLowerBound._0_4_ = (int)uVar9;
        pVVar10 = Specification::PoolingLayerParams::valid(_Kw);
        pBVar11 = Specification::ValidPadding::paddingamounts(pVVar10);
        pBVar12 = Specification::BorderAmounts::borderamounts(pBVar11,0);
        uVar9 = Specification::BorderAmounts_EdgeSizes::endedgesize(pBVar12);
        inputLowerBound._4_4_ = (int)uVar9;
        pVVar10 = Specification::PoolingLayerParams::valid(_Kw);
        pBVar11 = Specification::ValidPadding::paddingamounts(pVVar10);
        pBVar12 = Specification::BorderAmounts::borderamounts(pBVar11,1);
        uVar9 = Specification::BorderAmounts_EdgeSizes::startedgesize(pBVar12);
        b = (int)uVar9;
        pVVar10 = Specification::PoolingLayerParams::valid(_Kw);
        pBVar11 = Specification::ValidPadding::paddingamounts(pVVar10);
        pBVar12 = Specification::BorderAmounts::borderamounts(pBVar11,1);
        uVar9 = Specification::BorderAmounts_EdgeSizes::endedgesize(pBVar12);
        t = (int)uVar9;
      }
      if (0 < (hstride - inputLowerBound._4_4_) - (int)inputLowerBound) {
        pSVar7 = ShapeConstraint::heightRange(local_28);
        sVar14 = ShapeRange::minimumValue(pSVar7);
        if (sVar14 == 0) {
          local_3a8 = 0;
        }
        else {
          pSVar7 = ShapeConstraint::heightRange(local_28);
          sVar14 = ShapeRange::minimumValue(pSVar7);
          local_3a8 = sVar14 - 1;
        }
        local_98 = local_3a8;
        ShapeConstraint::lowerBoundHeight
                  (outputShape,
                   local_3a8 * l + (long)((hstride - inputLowerBound._4_4_) - (int)inputLowerBound))
        ;
      }
      pmVar6 = local_28;
      pSVar7 = ShapeConstraint::heightRange(outputShape);
      ShapeRange::operator+
                ((ShapeRange *)&inputLowerBound_1,pSVar7,
                 ((int)inputLowerBound + inputLowerBound._4_4_) - hstride);
      ShapeRange::operator/(&local_d8,(ShapeRange *)&inputLowerBound_1,(long)l);
      ShapeRange::operator+(&local_b8,&local_d8,1);
      ShapeConstraint::updateHeightRange(pmVar6,&local_b8);
      if (0 < (wstride - b) - t) {
        pSVar7 = ShapeConstraint::widthRange(local_28);
        sVar14 = ShapeRange::minimumValue(pSVar7);
        if (sVar14 == 0) {
          local_3b8 = 0;
        }
        else {
          pSVar7 = ShapeConstraint::widthRange(local_28);
          sVar14 = ShapeRange::minimumValue(pSVar7);
          local_3b8 = sVar14 - 1;
        }
        local_100 = local_3b8;
        ShapeConstraint::lowerBoundWidth(outputShape,local_3b8 * r + (long)((wstride - b) - t));
      }
      pmVar6 = local_28;
      pSVar7 = ShapeConstraint::widthRange(outputShape);
      ShapeRange::operator+(&local_160,pSVar7,(t + b) - wstride);
      ShapeRange::operator/(&local_140,&local_160,(long)r);
      ShapeRange::operator+(&local_120,&local_140,1);
      ShapeConstraint::updateWidthRange(pmVar6,&local_120);
      break;
    case kSame:
      pSVar7 = ShapeConstraint::heightRange(outputShape);
      ShapeRange::operator-(&local_1c0,pSVar7,1);
      ShapeRange::operator/(&local_1a0,&local_1c0,(long)l);
      ShapeRange::operator+(&local_180,&local_1a0,1);
      ShapeConstraint::updateHeightRange(pmVar6,&local_180);
      pmVar6 = local_28;
      pSVar7 = ShapeConstraint::widthRange(outputShape);
      ShapeRange::operator-((ShapeRange *)local_220,pSVar7,1);
      ShapeRange::operator/(&local_200,(ShapeRange *)local_220,(long)r);
      ShapeRange::operator+(&local_1e0,&local_200,1);
      ShapeConstraint::updateWidthRange(pmVar6,&local_1e0);
      break;
    case kIncludeLastPixel:
      pPVar13 = Specification::PoolingLayerParams::includelastpixel(_Kw);
      iVar3 = Specification::PoolingLayerParams_ValidCompletePadding::paddingamounts_size(pPVar13);
      if (iVar3 == 2) {
        pPVar13 = Specification::PoolingLayerParams::includelastpixel(_Kw);
        uVar9 = Specification::PoolingLayerParams_ValidCompletePadding::paddingamounts(pPVar13,0);
        inputLowerBound._0_4_ = (int)uVar9;
        pPVar13 = Specification::PoolingLayerParams::includelastpixel(_Kw);
        uVar9 = Specification::PoolingLayerParams_ValidCompletePadding::paddingamounts(pPVar13,1);
        b = (int)uVar9;
      }
      local_224 = 0;
      if (((int)inputLowerBound != 0) || (b != 0)) {
        sVar14 = ShapeConstraint::minimumHeight(outputShape);
        iVar3 = (int)inputLowerBound * 2 - hstride;
        iVar16 = l * 2;
        sVar15 = ShapeConstraint::minimumHeight(outputShape);
        if ((int)sVar15 + (int)inputLowerBound <= (int)sVar14 + iVar3 + -2 + iVar16) {
          local_224 = -1;
        }
      }
      pmVar6 = local_28;
      pSVar7 = ShapeConstraint::heightRange(outputShape);
      ShapeRange::operator+(&local_2a8,pSVar7,(int)inputLowerBound * 2 - hstride);
      ShapeRange::divideAndRoundUp(&local_288,&local_2a8,(long)l);
      ShapeRange::operator+(&local_268,&local_288,1);
      ShapeRange::operator+(&local_248,&local_268,local_224);
      ShapeConstraint::updateHeightRange(pmVar6,&local_248);
      pSVar1 = outputShape;
      if (0 < hstride + (int)inputLowerBound * -2) {
        pSVar7 = ShapeConstraint::heightRange(local_28);
        sVar14 = ShapeRange::minimumValue(pSVar7);
        ShapeConstraint::lowerBoundHeight
                  (pSVar1,(sVar14 - 1) + (long)(hstride + (int)inputLowerBound * -2));
      }
      local_224 = 0;
      if (((int)inputLowerBound != 0) || (b != 0)) {
        sVar14 = ShapeConstraint::minimumWidth(outputShape);
        iVar3 = b * 2 - wstride;
        iVar16 = r * 2;
        sVar15 = ShapeConstraint::minimumWidth(outputShape);
        if ((int)sVar15 + b <= (int)sVar14 + iVar3 + -2 + iVar16) {
          local_224 = -1;
        }
      }
      pmVar6 = local_28;
      pSVar7 = ShapeConstraint::widthRange(outputShape);
      ShapeRange::operator+(&local_328,pSVar7,b * 2 - wstride);
      ShapeRange::divideAndRoundUp(&local_308,&local_328,(long)r);
      ShapeRange::operator+(&local_2e8,&local_308,1);
      ShapeRange::operator+(&local_2c8,&local_2e8,local_224);
      ShapeConstraint::updateWidthRange(pmVar6,&local_2c8);
      pSVar1 = outputShape;
      if (0 < wstride + b * -2) {
        pSVar7 = ShapeConstraint::widthRange(local_28);
        sVar14 = ShapeRange::minimumValue(pSVar7);
        ShapeConstraint::lowerBoundHeight(pSVar1,(sVar14 - 1) + (long)(wstride + b * -2));
      }
    }
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapePoolingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(inputShape.channelRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    const Specification::PoolingLayerParams& pool = specLayer.pooling();

    int Kh, Kw, hstride, wstride;
    Kh = Kw = 3;
    hstride = wstride = 1;
    if (pool.kernelsize_size() == 2){
        Kh = static_cast<int>(pool.kernelsize(0)); //height
        Kw = static_cast<int>(pool.kernelsize(1)); //width
    }
    if (pool.stride_size() == 2){
        hstride = static_cast<int>(pool.stride(0)); //height
        wstride = static_cast<int>(pool.stride(1)); //width
    }

    int l, r, b, t;
    l = r = b = t = 0;

    if (pool.globalpooling()) {
        outputShape.setHeight(1);
        outputShape.setWidth(1);
    } else {
        switch (pool.PoolingPaddingType_case()) {
            case Specification::PoolingLayerParams::kValid:
                if (pool.valid().paddingamounts().borderamounts_size() == 2){
                    t = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).startedgesize());
                    b = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).endedgesize());
                    l = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).startedgesize());
                    r = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).endedgesize());
                }

                if (Kh - b - t > 0) {
                    size_t inputLowerBound = outputShape.heightRange().minimumValue() == 0 ? 0 : (outputShape.heightRange().minimumValue() - 1);
                    inputShape.lowerBoundHeight(inputLowerBound * static_cast<size_t>(hstride) + static_cast<size_t>(Kh - b - t));
//                    inputShape.lowerBoundHeight(inputLowerBound + static_cast<size_t>(Kh - b - t));
                }

                outputShape.updateHeightRange((inputShape.heightRange() + (t + b - Kh))/static_cast<size_t>(hstride) + 1);

                if (Kw - l - r > 0) {
                    size_t inputLowerBound = outputShape.widthRange().minimumValue() == 0 ? 0 : (outputShape.widthRange().minimumValue() - 1);
                    inputShape.lowerBoundWidth(inputLowerBound * static_cast<size_t>(wstride) + static_cast<size_t>(Kw - l - r));
//                    inputShape.lowerBoundWidth(inputLowerBound + static_cast<size_t>(Kw - l - r));
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (r + l - Kw))/static_cast<size_t>(wstride) + 1);

                break;
            case Specification::PoolingLayerParams::kSame:
                // needs to round up
                outputShape.updateHeightRange((inputShape.heightRange() - 1)/ static_cast<size_t>(hstride) + 1);
                outputShape.updateWidthRange((inputShape.widthRange() - 1) / static_cast<size_t>(wstride) + 1);
                break;
            case Specification::PoolingLayerParams::kIncludeLastPixel: {
                if (pool.includelastpixel().paddingamounts_size() == 2){
                    t = static_cast<int>(pool.includelastpixel().paddingamounts(0));
                    l = static_cast<int>(pool.includelastpixel().paddingamounts(1));
                }
                // subtracting in the numerator and adding 1 in order to get integer division rounded up
                int addExtra = 0;
                if (t || l) {
                    if ((static_cast<int>(inputShape.minimumHeight()) - 1 + (2*t - Kh - 1) + 2 * hstride) >= (static_cast<int>(inputShape.minimumHeight()) + t)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateHeightRange((inputShape.heightRange() + (2*t - Kh)).divideAndRoundUp(static_cast<size_t>(hstride)) + 1 + addExtra);
                if (Kh - 2*t > 0)
                    inputShape.lowerBoundHeight(outputShape.heightRange().minimumValue() - 1 + static_cast<size_t>(Kh - 2*t));

                addExtra = 0;
                if (t || l){
                    if ((static_cast<int>(inputShape.minimumWidth()) - 1 + (2*l - Kw - 1) + 2 * wstride) >= (static_cast<int>(inputShape.minimumWidth()) + l)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (2*l - Kw)).divideAndRoundUp(static_cast<size_t>(wstride)) + 1 + addExtra);
                if (Kw - 2*l > 0)
                    inputShape.lowerBoundHeight(outputShape.widthRange().minimumValue() - 1 + static_cast<size_t>(Kw - 2*l));
                break;
            }
            case Specification::PoolingLayerParams::POOLINGPADDINGTYPE_NOT_SET:
                throw std::runtime_error("Pooling padding type not set");
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}